

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O1

qreal QStyleOptionGraphicsItem::levelOfDetailFromTransform(QTransform *worldTransform)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long in_FS_OFFSET;
  QLineF local_a8;
  QLineF local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QTransform::type();
  if (iVar3 < 2) {
    dVar2 = 1.0;
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0x3ff0000000000000;
    uStack_30 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0x3ff0000000000000;
    QTransform::map(&local_88);
    dVar1 = (double)QLineF::length();
    QTransform::map(&local_a8);
    dVar2 = (double)QLineF::length();
    dVar2 = dVar2 * dVar1;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return dVar2;
  }
  __stack_chk_fail();
}

Assistant:

qreal QStyleOptionGraphicsItem::levelOfDetailFromTransform(const QTransform &worldTransform)
{
    if (worldTransform.type() <= QTransform::TxTranslate)
        return 1; // Translation only? The LOD is 1.

    // Two unit vectors.
    QLineF v1(0, 0, 1, 0);
    QLineF v2(0, 0, 0, 1);
    // LOD is the transformed area of a 1x1 rectangle.
    return qSqrt(worldTransform.map(v1).length() * worldTransform.map(v2).length());
}